

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool tinyusdz::usda::anon_unknown_1::ConstructPrimTreeRec
               (size_t primIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
               *prim_nodes,Prim *destPrim,string *err)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  size_t *psVar4;
  size_t sVar5;
  Prim *pPVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Link_type p_Var12;
  char *pcVar13;
  _Link_type p_Var14;
  char *pcVar15;
  _Rb_tree_header *p_Var16;
  int iVar17;
  unsigned_long *cidx;
  size_t *psVar18;
  char cVar19;
  int64_t vidx;
  VariantSet variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  variantSets;
  Variant variant;
  Prim prim;
  Prim variantChildPrim;
  ulong local_c20;
  _Base_ptr local_c18;
  undefined1 local_c10 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c00;
  Prim *local_bf0;
  pointer local_be8;
  _Base_ptr local_be0;
  _Base_ptr local_bd8;
  _Base_ptr local_bd0;
  undefined1 local_bc8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
  local_ba8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_b48;
  undefined1 local_b18 [8];
  undefined1 auStack_b10 [24];
  _Alloc_hider local_af8;
  undefined5 uStack_af0;
  undefined3 local_aeb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ae8;
  _Alloc_hider local_ad8;
  size_type local_ad0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  bool local_ab8;
  undefined1 local_ab0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a88;
  undefined1 local_a78 [48];
  bool local_a48;
  undefined1 local_a40 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a18;
  undefined1 local_a08 [48];
  undefined1 local_9d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_9b8;
  undefined1 local_9a8 [48];
  optional<bool> local_978;
  bool local_970;
  undefined1 local_968 [48];
  bool local_938;
  undefined1 local_930 [32];
  bool local_910;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  local_908;
  undefined1 local_8e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8c8;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_8b8;
  undefined1 local_898 [24];
  storage_union local_880 [2];
  bool local_860;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_858;
  bool local_838;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_830;
  bool local_810;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_808;
  _Rb_tree_node_base local_7e0;
  size_t local_7c0;
  _Rb_tree_node_base local_7b0;
  size_t local_790;
  pointer pTStack_788;
  pointer local_780;
  pointer pTStack_778;
  pointer pTStack_770;
  undefined1 uStack_768;
  undefined7 local_767;
  undefined1 uStack_760;
  undefined8 uStack_75f;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_750;
  bool local_730;
  undefined1 auStack_728 [32];
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_708;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> vStack_6f0;
  undefined1 local_6d0 [656];
  Specifier local_440;
  any aStack_438;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> local_420;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mStack_408;
  bool local_3d8;
  bool bStack_3d7;
  undefined1 auStack_3d0 [24];
  int64_t local_3b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_3b0;
  storage_union local_380;
  undefined **local_370 [104];
  
  if (destPrim == (Prim *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar15 = (char *)err->_M_string_length;
    pcVar13 = "`destPrim` is nullptr.\n";
LAB_001298ea:
    ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar15,(ulong)pcVar13);
    return false;
  }
  pPVar1 = (prim_nodes->
           super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(prim_nodes->
                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
          -0x30c30c30c30c30c3;
  if (uVar9 < primIdx || uVar9 - primIdx == 0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar15 = (char *)err->_M_string_length;
    pcVar13 = "primIndex exceeds prim_nodes.size()\n";
    goto LAB_001298ea;
  }
  local_be8 = pPVar1 + primIdx;
  local_bf0 = destPrim;
  Prim::Prim((Prim *)local_6d0,&local_be8->prim);
  ::std::__cxx11::string::_M_assign((string *)(local_6d0 + 0x270));
  local_b78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b78._M_impl.super__Rb_tree_header._M_header;
  local_b78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b48._M_impl.super__Rb_tree_header._M_header;
  local_b48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b48._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b48._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = *(_Base_ptr *)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 0x18);
  local_be0 = (_Base_ptr)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 8);
  local_b78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var11 != local_be0) {
    do {
      local_bc8._0_8_ = local_bc8 + 0x10;
      local_c18 = p_Var11 + 1;
      local_bc8._8_8_ = 0;
      local_bc8[0x10] = '\0';
      local_ba8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_ba8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_ba8._M_impl.super__Rb_tree_header._M_header;
      local_ba8._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var10 = p_Var11[2]._M_right;
      local_bd0 = (_Base_ptr)&p_Var11[2]._M_parent;
      local_bd8 = p_Var11;
      local_ba8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_ba8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var10 != local_bd0) {
        do {
          auStack_b10._0_8_ = auStack_b10._0_8_ & 0xffffffff00000000;
          auStack_b10._8_8_ = (_Link_type)0x0;
          auStack_b10._16_8_ = (_Base_ptr)(local_b18 + 8);
          local_af8._M_p = (pointer)(local_b18 + 8);
          aStack_ae8._8_4_ = 0;
          aStack_ae8._M_allocated_capacity._0_5_ = 0;
          uStack_af0 = 0;
          local_aeb = 0;
          local_ad8._M_p = (pointer)&local_ac8;
          local_ad0 = 0;
          local_ac8._M_local_buf[0] = '\0';
          local_ab8 = false;
          local_970 = false;
          local_808._16_8_ = 0;
          local_808._24_8_ = 0;
          local_808.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_808._8_8_ = 0;
          local_7e0._M_color = _S_red;
          local_7e0._M_parent = (_Base_ptr)0x0;
          aStack_a88._M_local_buf[8] = false;
          local_ab0._32_8_ = 0;
          aStack_a88._M_allocated_capacity = 0;
          local_ab0._16_8_ = 0;
          local_ab0._24_8_ = 0;
          local_ab0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_ab0._8_8_ = 0;
          local_a48 = false;
          local_a78._32_8_ = 0;
          local_a78._40_8_ = 0;
          local_a78._16_8_ = 0;
          local_a78._24_8_ = 0;
          local_a78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a78._8_8_ = 0;
          aStack_a18._M_local_buf[8] = false;
          local_a40._32_8_ = 0;
          aStack_a18._M_allocated_capacity = 0;
          local_a40._16_8_ = 0;
          local_a40._24_8_ = 0;
          local_a40._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a40._8_8_ = 0;
          local_9d8[0] = false;
          local_a08._32_8_ = 0;
          local_a08._40_8_ = 0;
          local_a08._16_8_ = 0;
          local_a08._24_8_ = 0;
          local_a08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a08._8_8_ = 0;
          aStack_9b8._M_local_buf[8] = false;
          local_9d8._24_8_ = 0;
          aStack_9b8._M_allocated_capacity = 0;
          local_9d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_9d8._16_8_ = 0;
          local_9a8._32_8_ = 0;
          local_9a8._40_8_ = 0;
          local_9a8._16_8_ = 0;
          local_9a8._24_8_ = 0;
          local_9a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_9a8._8_8_ = 0;
          local_978.has_value_ = false;
          local_978.contained = (storage_t<bool>)0x0;
          local_938 = false;
          local_968._32_8_ = 0;
          local_968._40_8_ = 0;
          local_968._16_8_ = 0;
          local_968._24_8_ = 0;
          local_968._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_968._8_8_ = 0;
          local_910 = false;
          local_930._16_8_ = 0;
          local_930._24_8_ = 0;
          local_930._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_930._8_8_ = 0;
          local_8e8[0] = false;
          local_908._16_8_ = 0;
          local_908._24_8_ = 0;
          local_908.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_908._8_8_ = 0;
          aStack_8c8._M_local_buf[8] = false;
          local_8e8._24_8_ = 0;
          aStack_8c8._M_allocated_capacity = 0;
          local_8e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_8e8._16_8_ = 0;
          local_898[0] = false;
          local_8b8._16_8_ = 0;
          local_8b8._24_8_ = 0;
          local_8b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_8b8._8_8_ = 0;
          local_860 = false;
          local_880[1]._0_8_ = 0;
          local_880[1]._8_8_ = 0;
          local_880[0].dynamic = (void *)0x0;
          local_880[0]._8_8_ = 0;
          local_898._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_898._16_8_ = 0;
          local_838 = false;
          local_858._16_8_ = 0;
          local_858._24_8_ = 0;
          local_858.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_858._8_8_ = 0;
          local_810 = false;
          local_830._16_8_ = 0;
          local_830._24_8_ = 0;
          local_830.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_830._8_8_ = 0;
          local_7e0._M_left = &local_7e0;
          local_7e0._M_right = &local_7e0;
          local_7c0 = 0;
          local_7b0._M_color = _S_red;
          local_7b0._M_parent = (_Base_ptr)0x0;
          local_7b0._M_left = &local_7b0;
          local_7b0._M_right = &local_7b0;
          uStack_760 = 0;
          uStack_75f = 0;
          pTStack_770 = (pointer)0x0;
          uStack_768 = 0;
          local_767 = 0;
          local_780 = (pointer)0x0;
          pTStack_778 = (pointer)0x0;
          local_790 = 0;
          pTStack_788 = (pointer)0x0;
          local_730 = false;
          local_750._16_8_ = 0;
          local_750._24_8_ = 0;
          local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_750._8_8_ = 0;
          auStack_728[0x10] = 0;
          auStack_728._17_8_ = 0;
          auStack_728._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_728[8] = 0;
          auStack_728._9_7_ = 0;
          vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_708._16_8_ = 0;
          vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_708.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_708._8_8_ = 0;
          p_Var2 = p_Var10[0x23]._M_left;
          for (p_Var11 = p_Var10[0x23]._M_parent; bVar8 = p_Var11 == p_Var2, !bVar8;
              p_Var11 = (_Base_ptr)&p_Var11->_M_parent) {
            p_Var16 = &local_b78._M_impl.super__Rb_tree_header;
            local_c20 = *(ulong *)p_Var11;
            p_Var12 = (_Link_type)p_Var16;
            for (p_Var14 = (_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var14 != (_Link_type)0x0;
                p_Var14 = *(_Link_type *)
                           (&p_Var14->_M_storage)[(ulong)((long)sVar3 < (long)local_c20) - 2].
                           _M_storage) {
              sVar3 = *(size_t *)(p_Var14->_M_storage)._M_storage;
              if ((long)local_c20 <= (long)sVar3) {
                p_Var12 = p_Var14;
              }
            }
            p_Var14 = (_Link_type)p_Var16;
            if (((_Rb_tree_header *)p_Var12 != p_Var16) &&
               (p_Var14 = p_Var12,
               (long)local_c20 < (long)*(size_t *)(p_Var12->_M_storage)._M_storage)) {
              p_Var14 = (_Link_type)p_Var16;
            }
            if ((_Rb_tree_header *)p_Var14 != p_Var16) {
              if (err != (string *)0x0) {
                local_c10._0_8_ = &local_c00;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c10,"variant primIdx {} is referenced multiple times.\n",
                           "");
                fmt::format<long>((string *)&local_380,(string *)local_c10,(long *)&local_c20);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_380);
                if ((undefined ***)local_380.dynamic != local_370) {
                  operator_delete(local_380.dynamic,(long)local_370[0] + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c10._0_8_ != &local_c00) {
                  operator_delete((void *)local_c10._0_8_,local_c00._M_allocated_capacity + 1);
                }
              }
LAB_001294f6:
              iVar17 = 1;
              goto LAB_001294fc;
            }
            if (((long)local_c20 < 0) ||
               ((ulong)(((long)(prim_nodes->
                               super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(prim_nodes->
                               super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                       -0x30c30c30c30c30c3) < local_c20)) {
              if (err != (string *)0x0) {
                ::std::__cxx11::string::_M_replace
                          ((ulong)err,0,(char *)err->_M_string_length,0x3b040f);
              }
              goto LAB_001294f6;
            }
            local_c00._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_c10._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            Prim::Prim((Prim *)&local_380,(Value *)local_c10);
            if ((undefined **)local_c00._M_allocated_capacity != (undefined **)0x0) {
              (**(code **)(local_c00._M_allocated_capacity + 0x20))((string *)local_c10);
              local_c00._M_allocated_capacity = 0;
            }
            bVar7 = ConstructPrimTreeRec(local_c20,prim_nodes,(Prim *)&local_380,err);
            if (!bVar7) {
              Prim::~Prim((Prim *)&local_380);
              goto LAB_001294f6;
            }
            ::std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>::
            emplace_back<tinyusdz::Prim&>
                      ((vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>> *)&vStack_6f0,
                       (Prim *)&local_380);
            Prim::~Prim((Prim *)&local_380);
            ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&local_b78,(long *)&local_c20);
          }
          iVar17 = 6;
LAB_001294fc:
          if (bVar8) {
            PrimMetas::operator=((PrimMetas *)&aStack_ae8,(PrimMetas *)(p_Var10 + 2));
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)local_b18,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)&p_Var10[0x21]._M_right);
            ::std::__cxx11::string::_M_assign((string *)local_bc8);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Variant>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
                        *)&local_ba8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1),(Variant *)local_b18);
            iVar17 = 0;
          }
          std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector(&vStack_6f0);
          PrimMetas::~PrimMetas((PrimMetas *)&aStack_ae8);
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)local_b18,(_Link_type)auStack_b10._8_8_);
          if (iVar17 != 0) goto LAB_001295af;
          p_Var10 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
        } while (p_Var10 != local_bd0);
      }
      iVar17 = 4;
LAB_001295af:
      if (iVar17 == 4) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSet>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
                    *)&local_b48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c18,
                   (VariantSet *)local_bc8);
        iVar17 = 0;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
      ::_M_erase(&local_ba8,(_Link_type)local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      if ((undefined1 *)local_bc8._0_8_ != local_bc8 + 0x10) {
        operator_delete((void *)local_bc8._0_8_,CONCAT71(local_bc8._17_7_,local_bc8[0x10]) + 1);
      }
      if (iVar17 != 0) goto LAB_0012962e;
      p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_bd8);
    } while (p_Var11 != local_be0);
    iVar17 = 2;
LAB_0012962e:
    if (iVar17 != 2) {
LAB_001298fa:
      bVar8 = false;
      goto LAB_001298fc;
    }
  }
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::operator=(&local_3b0,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
               *)&local_b48);
  psVar18 = (local_be8->children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar4 = (local_be8->children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar18 != psVar4) {
    do {
      p_Var16 = &local_b78._M_impl.super__Rb_tree_header;
      sVar3 = *psVar18;
      p_Var12 = (_Link_type)p_Var16;
      for (p_Var14 = (_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var14 != (_Link_type)0x0;
          p_Var14 = *(_Link_type *)
                     (&p_Var14->_M_storage)[(ulong)((long)sVar5 < (long)sVar3) - 2]._M_storage) {
        sVar5 = *(size_t *)(p_Var14->_M_storage)._M_storage;
        if ((long)sVar3 <= (long)sVar5) {
          p_Var12 = p_Var14;
        }
      }
      p_Var14 = (_Link_type)p_Var16;
      if (((_Rb_tree_header *)p_Var12 != p_Var16) &&
         (p_Var14 = p_Var12, (long)sVar3 < (long)*(size_t *)(p_Var12->_M_storage)._M_storage)) {
        p_Var14 = (_Link_type)p_Var16;
      }
      cVar19 = '\t';
      if ((_Rb_tree_header *)p_Var14 == p_Var16) {
        local_370[0] = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_380.dynamic = (undefined ***)0x0;
        Prim::Prim((Prim *)local_b18,(Value *)&local_380);
        if (local_370[0] != (undefined **)0x0) {
          (*(code *)local_370[0][4])(&local_380);
          local_370[0] = (undefined **)0x0;
        }
        bVar8 = ConstructPrimTreeRec(*psVar18,prim_nodes,(Prim *)local_b18,err);
        cVar19 = !bVar8;
        if (!(bool)cVar19) {
          ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
          emplace_back<tinyusdz::Prim>(&local_420,(Prim *)local_b18);
        }
        Prim::~Prim((Prim *)local_b18);
      }
      if ((cVar19 != '\t') && (cVar19 != '\0')) goto LAB_001298fa;
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar4);
  }
  pPVar6 = local_bf0;
  Path::operator=(&local_bf0->_abs_path,(Path *)local_6d0);
  Path::operator=(&pPVar6->_path,(Path *)(local_6d0 + 0xd0));
  Path::operator=(&pPVar6->_elementPath,(Path *)(local_6d0 + 0x1a0));
  ::std::__cxx11::string::operator=
            ((string *)&pPVar6->_prim_type_name,(string *)(local_6d0 + 0x270));
  pPVar6->_specifier = local_440;
  linb::any::operator=(&(pPVar6->_data).v_,&aStack_438);
  local_b18 = (undefined1  [8])
              (pPVar6->_children).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_b10._0_8_ =
       (pPVar6->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  auStack_b10._8_8_ =
       (pPVar6->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pPVar6->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pPVar6->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pPVar6->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector
            ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)local_b18);
  ::std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar6->_childrenNameSet,&mStack_408);
  pPVar6->_child_dirty = local_3d8;
  pPVar6->_primChildrenIndicesIsValid = bStack_3d7;
  ::std::vector<long,_std::allocator<long>_>::_M_move_assign
            ((vector<long,_std::allocator<long>_> *)&pPVar6->_primChildrenIndices,auStack_3d0);
  pPVar6->_prim_id = local_3b8;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
               *)&pPVar6->_variantSets,&local_3b0);
  bVar8 = true;
LAB_001298fc:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::_M_erase(&local_b48,(_Link_type)local_b48._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_erase(&local_b78,(_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent);
  Prim::~Prim((Prim *)local_6d0);
  return bVar8;
}

Assistant:

bool ConstructPrimTreeRec(const size_t primIdx,
                        const std::vector<PrimNode> &prim_nodes,
                        Prim *destPrim,
                        std::string *err) {

  if (!destPrim) {
    if (err) {
      (*err) = "`destPrim` is nullptr.\n";
    }
    return false;
  }

  if (primIdx >= prim_nodes.size()) {
    if (err) {
      (*err) = "primIndex exceeds prim_nodes.size()\n";
    }
    return false;
  }

  const auto &node = prim_nodes[primIdx];

  Prim prim(node.prim);
  prim.prim_type_name() = node.typeName;

  DCOUT("prim[" << primIdx << "].type = " << node.prim.type_name());
  DCOUT("prim[" << primIdx << "].variantNodeMap.size = " << node.variantNodeMap.size());
  //prim.prim_id() = int64_t(idx);

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices

  std::map<std::string, VariantSet> variantSets;
  for (const auto &variantNodes : node.variantNodeMap) {
    DCOUT("variantSet " << variantNodes.first);
    VariantSet variantSet;
    for (const auto &item : variantNodes.second) {
      DCOUT("variant " << item.first);
      Variant variant;
      for (const int64_t vidx : item.second.primChildren) {
        if (variantChildrenIndices.count(vidx)) {
          // Duplicated variant childrenIndices
          if (err) {
            (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
          }
          return false;
        } else {
          // Add prim to variants
          if ((vidx >= 0) && (size_t(vidx) <= prim_nodes.size())) {

            Prim variantChildPrim(value::Value(nullptr)); // dummy
            if (!ConstructPrimTreeRec(size_t(vidx), prim_nodes, &variantChildPrim, err)) {
              return false;
            }

            DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.element_name(), variantNodes.first, item.first));
            variant.primChildren().emplace_back(variantChildPrim);
          } else {
            if (err) {
              (*err) = "primIndex exceeds prim_nodes.size()\n";
            }
            return false;
          }

          variantChildrenIndices.insert(vidx);
        }
      }
      variant.metas() = std::move(item.second.metas);
      variant.properties() = std::move(item.second.props);

      variantSet.name = variantNodes.first;
      variantSet.variantSet.emplace(item.first, std::move(variant));
    }
    variantSets.emplace(variantNodes.first, std::move(variantSet));
  }
  prim.variantSets() = std::move(variantSets);

  for (const auto &cidx : node.children) {
    if (variantChildrenIndices.count(int64_t(cidx))) {
      // Prim is processed
      continue;
    }

    Prim childPrim(value::Value(nullptr)); // dummy
    if (!ConstructPrimTreeRec(cidx, prim_nodes, &childPrim, err)) {
      return false;
    }

    prim.children().emplace_back(std::move(childPrim));
  }

  (*destPrim) = std::move(prim);
  return true;
}